

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

array_n<char,_3,_std::allocator<char>_> * __thiscall
sisl::array_n<char,_3,_std::allocator<char>_>::operator=
          (array_n<char,_3,_std::allocator<char>_> *this,
          array_n<char,_3,_std::allocator<char>_> *obj)

{
  int local_44;
  undefined1 local_40 [4];
  int i;
  array_n<char,_3,_std::allocator<char>_> copy;
  array_n<char,_3,_std::allocator<char>_> *obj_local;
  array_n<char,_3,_std::allocator<char>_> *this_local;
  
  copy.last = (pointer)obj;
  array_n((array_n<char,_3,_std::allocator<char>_> *)local_40,obj);
  for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
    std::swap<unsigned_int>(this->_dims + local_44,copy._dims + (long)local_44 + -2);
  }
  std::swap<char*>(&this->first,(char **)(copy._dims + 2));
  std::swap<char*>(&this->last,&copy.first);
  std::swap<char*>(&this->_array,(char **)local_40);
  ~array_n((array_n<char,_3,_std::allocator<char>_> *)local_40);
  return this;
}

Assistant:

array_n &operator=(const array_n &obj){
            array_n copy(obj);

            for(int i = 0; i < N; i++) {
                std::swap(_dims[i], copy._dims[i]);
            }
            std::swap(first, copy.first);
            std::swap(last, copy.last);
            std::swap(_array, copy._array);

            return *this;
        }